

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analog.cpp
# Opt level: O1

double __thiscall E64::analog_ic::pitch_bend(analog_ic *this)

{
  uint uVar1;
  uint uVar2;
  double in_XMM0_Qa;
  
  if (this->pitch_samples_remaining != 0) {
    this->pitch_samples_remaining = this->pitch_samples_remaining - 1;
    uVar1 = this->pitch_bend_phase_delta + 0x5dc00;
    uVar2 = uVar1 / this->pitch_samples + this->pitch_bend_phase;
    this->pitch_bend_phase = uVar2;
    this->pitch_bend_phase_delta = uVar1 % this->pitch_samples;
    if ((this->pitch_bend_on == true) &&
       (in_XMM0_Qa = (this->pitch_equal_tempered_scale[this->pitch_factor] + -1.0) *
                     this->exponential_decrease[uVar2] + 1.0, this->pitch_up == true)) {
      in_XMM0_Qa = 1.0 / in_XMM0_Qa;
    }
    if (this->pitch_bend_on != false) {
      return in_XMM0_Qa;
    }
  }
  return 1.0;
}

Assistant:

double E64::analog_ic::pitch_bend()
{
	if (pitch_samples_remaining) {
		pitch_samples_remaining--;
		pitch_bend_phase += (TABLE_SIZE + pitch_bend_phase_delta) / pitch_samples;
		pitch_bend_phase_delta = (TABLE_SIZE + pitch_bend_phase_delta) % pitch_samples;
		
		double result =
			(exponential_decrease[pitch_bend_phase] *
			(pitch_equal_tempered_scale[pitch_factor] - 1.0)) + 1.0;
		
		if (pitch_bend_on) {
			if (pitch_up) {
				return 1.0 / result;
			} else {
				return result;
			}
		}
	}
	return 1.0;
}